

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_bruiser.cpp
# Opt level: O2

int AF_A_BruisAttack(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  TObjPtr<AActor> *obj;
  VM_UBYTE VVar1;
  DObject *this;
  DAngle angle;
  bool bVar2;
  int iVar3;
  int iVar4;
  AActor *pAVar5;
  PClassActor *type;
  AActor *this_00;
  char *__assertion;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  FName local_28;
  FSoundID local_24;
  undefined8 local_20;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_0051f083;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    this_00 = *(AActor **)&param->field_0;
    if ((param->field_0).field_1.atag == 1) {
      if (this_00 == (AActor *)0x0) {
LAB_0051ef08:
        this_00 = (AActor *)0x0;
      }
      else {
        bVar2 = DObject::IsKindOf((DObject *)this_00,AActor::RegistrationInfo.MyClass);
        if (!bVar2) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0051f083;
        }
      }
      if (numparam == 1) goto LAB_0051ef88;
      VVar1 = param[1].field_0.field_3.Type;
      if (VVar1 != 0xff) {
        if (VVar1 != '\x03') goto LAB_0051f073;
        this = (DObject *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (this != (DObject *)0x0) {
            bVar2 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
            if (!bVar2) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_0051f083;
            }
          }
        }
        else if (this != (DObject *)0x0) goto LAB_0051f073;
      }
      if ((((uint)numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
         ((VVar1 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_0051ef88:
        obj = &this_00->target;
        pAVar5 = GC::ReadBarrier<AActor>((AActor **)obj);
        if (pAVar5 != (AActor *)0x0) {
          bVar2 = AActor::CheckMeleeRange(this_00);
          if (bVar2) {
            iVar3 = FRandom::operator()(&pr_bruisattack);
            iVar3 = (iVar3 % 8) * 10 + 10;
            local_24.ID = S_FindSound("baron/melee");
            S_Sound(this_00,1,&local_24,1.0,1.0);
            pAVar5 = GC::ReadBarrier<AActor>((AActor **)obj);
            local_28.Index = 0x84;
            local_20 = 0;
            angle.Degrees._4_4_ = extraout_XMM0_Db;
            angle.Degrees._0_4_ = extraout_XMM0_Da;
            iVar4 = P_DamageMobj(pAVar5,this_00,this_00,iVar3,&local_28,0,angle);
            if (0 < iVar4) {
              iVar3 = iVar4;
            }
            pAVar5 = GC::ReadBarrier<AActor>((AActor **)obj);
            P_TraceBleed(iVar3,pAVar5,this_00);
          }
          else {
            pAVar5 = GC::ReadBarrier<AActor>((AActor **)obj);
            type = PClass::FindActor("BaronBall");
            P_SpawnMissile(this_00,pAVar5,type,(AActor *)0x0);
          }
        }
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_0051f083;
    }
    if (this_00 == (AActor *)0x0) goto LAB_0051ef08;
  }
LAB_0051f073:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_0051f083:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_bruiser.cpp"
                ,6,"int AF_A_BruisAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_BruisAttack)
{
	PARAM_ACTION_PROLOGUE;

	if (!self->target)
		return 0;
				
	if (self->CheckMeleeRange ())
	{
		int damage = (pr_bruisattack()%8+1)*10;
		S_Sound (self, CHAN_WEAPON, "baron/melee", 1, ATTN_NORM);
		int newdam = P_DamageMobj (self->target, self, self, damage, NAME_Melee);
		P_TraceBleed (newdam > 0 ? newdam : damage, self->target, self);
		return 0;
	}
	
	// launch a missile
	P_SpawnMissile (self, self->target, PClass::FindActor("BaronBall"));
	return 0;
}